

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>_>
* __thiscall
poly::vector_impl::
allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>_>
::copy_assign_impl(allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>_>
                   *this,long *a)

{
  void *pvVar1;
  ulong uVar2;
  
  uVar2 = a[1] - *a;
  if (uVar2 == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    if ((long)uVar2 < 0) {
      std::__throw_bad_alloc();
    }
    pvVar1 = operator_new(uVar2);
  }
  operator_delete(this->_storage,(long)this->_end_storage - (long)this->_storage);
  this->_end_storage = (void_pointer)0x0;
  this->_storage = pvVar1;
  this->_end_storage = (void_pointer)((a[1] - *a) + (long)pvVar1);
  return this;
}

Assistant:

allocator_base& copy_assign_impl(const allocator_base& a, std::false_type /*unused*/)
        {
            pointer s = nullptr;
            if (a.size()) {
                s = get_allocator_ref().allocate(a.size());
            }
            tidy();
            _storage     = s;
            _end_storage = s + a.size();
            return *this;
        }